

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O0

void __thiscall icu_63::UnhandledEngine::handleCharacter(UnhandledEngine *this,UChar32 c)

{
  UBool UVar1;
  int32_t value;
  UnicodeSet *this_00;
  undefined4 in_register_00000034;
  UnicodeSet *local_50;
  UErrorCode local_38;
  int32_t script;
  UErrorCode status;
  undefined1 local_21;
  UnicodeSet *local_20;
  UChar32 local_14;
  UnhandledEngine *pUStack_10;
  UChar32 c_local;
  UnhandledEngine *this_local;
  
  local_14 = c;
  pUStack_10 = this;
  if (this->fHandled == (UnicodeSet *)0x0) {
    this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,CONCAT44(in_register_00000034,c));
    local_21 = 0;
    local_50 = (UnicodeSet *)0x0;
    if (this_00 != (UnicodeSet *)0x0) {
      local_21 = 1;
      local_20 = this_00;
      UnicodeSet::UnicodeSet(this_00);
      local_50 = this_00;
    }
    this->fHandled = local_50;
    if (this->fHandled == (UnicodeSet *)0x0) {
      return;
    }
  }
  UVar1 = UnicodeSet::contains(this->fHandled,local_14);
  if (UVar1 == '\0') {
    local_38 = U_ZERO_ERROR;
    value = u_getIntPropertyValue_63(local_14,UCHAR_SCRIPT);
    UnicodeSet::applyIntPropertyValue(this->fHandled,UCHAR_SCRIPT,value,&local_38);
  }
  return;
}

Assistant:

void
UnhandledEngine::handleCharacter(UChar32 c) {
    if (fHandled == nullptr) {
        fHandled = new UnicodeSet();
        if (fHandled == nullptr) {
            return;
        }
    }
    if (!fHandled->contains(c)) {
        UErrorCode status = U_ZERO_ERROR;
        // Apply the entire script of the character.
        int32_t script = u_getIntPropertyValue(c, UCHAR_SCRIPT);
        fHandled->applyIntPropertyValue(UCHAR_SCRIPT, script, status);
    }
}